

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall
Args::Arg::Arg<char_const(&)[11]>
          (Arg *this,Char flag,char (*name) [11],bool isWithValue,bool isRequired)

{
  byte in_CL;
  char *in_RDX;
  char in_SIL;
  ArgIface *in_RDI;
  byte in_R8B;
  allocator local_2e;
  allocator local_2d [18];
  allocator local_1b;
  byte local_1a;
  byte local_19;
  char *local_18;
  char local_9;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  local_9 = in_SIL;
  ArgIface::ArgIface(in_RDI);
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__Arg_001bd028;
  *(byte *)&in_RDI[1]._vptr_ArgIface = local_19 & 1;
  *(byte *)((long)&in_RDI[1]._vptr_ArgIface + 1) = local_1a & 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ArgIface + 2) = 0;
  std::__cxx11::string::string((string *)&in_RDI[1].m_cmdLine);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[3].m_cmdLine,1,local_9,&local_1b);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[5].m_cmdLine,local_18,local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[7].m_cmdLine,"arg",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::__cxx11::string::string((string *)&in_RDI[9].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[0xb].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[0xd].m_cmdLine);
  return;
}

Assistant:

Arg::Arg( Char flag, T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_flag( 1, flag )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}